

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int av1_get_q_for_deltaq_objective
              (AV1_COMP *cpi,ThreadData_conflict *td,int64_t *delta_dist,BLOCK_SIZE bsize,int mi_row
              ,int mi_col)

{
  byte right_shift;
  byte bVar1;
  byte bVar2;
  int stride;
  long lVar3;
  int16_t iVar4;
  int16_t iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int mi_col_00;
  int iVar9;
  int iVar10;
  char *pcVar11;
  long *plVar12;
  long lVar13;
  byte in_CL;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar14;
  double dVar15;
  double dVar16;
  double sbs_rate;
  double sbs_dist;
  int sbs_qstep;
  int frm_qstep;
  int qindex;
  DeltaQInfo *delta_q_info;
  double r0;
  double rk;
  double beta;
  int offset;
  double dist_scaled;
  int64_t mc_dep_delta;
  double cbcmp;
  TplDepStats *this_stats;
  int col;
  int row;
  int col_step_sr;
  int row_step;
  int step;
  int mi_cols_sr;
  int mi_col_end_sr;
  int mi_col_sr;
  int tpl_stride;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  int base_qindex;
  int mi_high;
  int mi_wide;
  double srcrf_rate;
  double srcrf_sse;
  double srcrf_dist;
  double cbcmp_base;
  double mc_dep_cost;
  double mc_dep_reg;
  double intra_cost;
  uint8_t block_mis_log2;
  TplParams *tpl_data;
  int tpl_idx;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined8 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int local_148;
  int in_stack_fffffffffffffebc;
  aom_bit_depth_t bit_depth;
  long in_stack_fffffffffffffec0;
  int local_cc;
  int local_c8;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  int local_4;
  
  right_shift = *(byte *)(*in_RDI + 0xd2ac);
  local_58 = 0.0;
  local_60 = 0.0;
  local_68 = 0.0;
  local_70 = 1.0;
  local_78 = 0.0;
  local_80 = 0.0;
  local_88 = 0.0;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_CL];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_CL];
  local_4 = (int)in_RDI[0x783d];
  if (*(byte *)(in_RDI + 0xe258) < 0x60) {
    pcVar11 = (char *)(*(long *)(*in_RDI + 0x12298) +
                      (long)(int)(uint)*(byte *)(in_RDI + 0xe258) * 0x60);
    lVar3 = *(long *)(pcVar11 + 8);
    stride = *(int *)(pcVar11 + 0x40);
    if (*pcVar11 != '\0') {
      iVar6 = coded_to_superres_mi(in_R9D,(uint)*(byte *)(in_RDI + 0x77fa));
      iVar7 = coded_to_superres_mi(in_R9D + (uint)bVar1,(uint)*(byte *)(in_RDI + 0x77fa));
      iVar8 = av1_pixels_to_mi((int)in_RDI[0x77f9]);
      mi_col_00 = 1 << (right_shift & 0x1f);
      iVar9 = coded_to_superres_mi(mi_col_00,(uint)*(byte *)(in_RDI + 0x77fa));
      local_c8 = in_R8D;
      while( true ) {
        bit_depth = (aom_bit_depth_t)in_stack_fffffffffffffec0;
        iVar10 = (int)in_stack_fffffffffffffea0;
        local_cc = iVar6;
        if ((int)(in_R8D + (uint)bVar2) <= local_c8) break;
        for (; local_cc < iVar7; local_cc = iVar9 + local_cc) {
          if ((local_c8 < *(int *)((long)in_RDI + 0x3c194)) && (local_cc < iVar8)) {
            in_stack_fffffffffffffec0 = lVar3;
            iVar10 = av1_tpl_ptr_pos(local_c8,local_cc,stride,right_shift);
            plVar12 = (long *)(in_stack_fffffffffffffec0 + (long)iVar10 * 200);
            dVar14 = (double)plVar12[1];
            lVar13 = (plVar12[8] * (long)*(int *)(pcVar11 + 0x54) + 0x100 >> 9) + plVar12[9] * 0x80;
            dVar15 = (double)(plVar12[3] << 7);
            dVar16 = log(dVar15);
            local_58 = dVar16 * dVar14 + local_58;
            dVar16 = log(dVar15 + (double)lVar13);
            local_68 = dVar16 * dVar14 + local_68;
            dVar15 = log(dVar15 * 3.0 + (double)lVar13);
            local_60 = dVar15 * dVar14 + local_60;
            local_78 = (double)(plVar12[1] << 7) + local_78;
            local_80 = (double)(*plVar12 << 7) + local_80;
            local_88 = (double)((int)plVar12[0x12] << 4) + local_88;
            local_70 = dVar14 + local_70;
          }
        }
        local_c8 = mi_col_00 + local_c8;
      }
      if ((0.0 < local_68) && (0.0 < local_58)) {
        dVar14 = exp((local_58 - local_68) / local_70);
        dVar15 = exp((local_58 - local_60) / local_70);
        *(double *)(in_RSI + 0x4220) = dVar15;
        local_148 = av1_get_deltaq_offset
                              (bit_depth,in_stack_fffffffffffffebc,
                               (double)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                              );
        if (*(int *)((long)in_RDI + 0x41ed4) * 9 + -1 <= local_148) {
          local_148 = *(int *)((long)in_RDI + 0x41ed4) * 9 + -1;
        }
        if (local_148 <= *(int *)((long)in_RDI + 0x41ed4) * -9 + 1) {
          local_148 = *(int *)((long)in_RDI + 0x41ed4) * -9 + 1;
        }
        local_4 = (int)in_RDI[0x783d] + local_148;
        if (0xfe < local_4) {
          local_4 = 0xff;
        }
        if (local_4 < 1) {
          local_4 = 0;
        }
        iVar4 = av1_dc_quant_QTX(iVar10,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        iVar5 = av1_dc_quant_QTX(iVar10,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        if (in_RDX != (long *)0x0) {
          dVar15 = pow((double)(int)iVar5 / (double)(int)iVar4,2.0);
          if (local_78 * dVar15 < local_80) {
            local_80 = local_78 * dVar15;
          }
          *in_RDX = (long)((local_80 - local_78) / dVar14);
          *in_RDX = ((long)*(int *)(pcVar11 + 0x54) * 0x400 + 0x100 >> 9) + *in_RDX;
          *in_RDX = ((long)(local_88 * ((double)(int)iVar4 / (double)(int)iVar5) - local_88) *
                     (long)*(int *)(pcVar11 + 0x54) + 0x100 >> 9) + *in_RDX;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int av1_get_q_for_deltaq_objective(AV1_COMP *const cpi, ThreadData *td,
                                   int64_t *delta_dist, BLOCK_SIZE bsize,
                                   int mi_row, int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  double intra_cost = 0;
  double mc_dep_reg = 0;
  double mc_dep_cost = 0;
  double cbcmp_base = 1;
  double srcrf_dist = 0;
  double srcrf_sse = 0;
  double srcrf_rate = 0;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];
  const int base_qindex = cm->quant_params.base_qindex;

  if (tpl_idx >= MAX_TPL_FRAME_IDX) return base_qindex;

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;
  if (!tpl_frame->is_valid) return base_qindex;

#ifndef NDEBUG
  int mi_count = 0;
#endif
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int step = 1 << block_mis_log2;
  const int row_step = step;
  const int col_step_sr =
      coded_to_superres_mi(step, cm->superres_scale_denominator);
  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) continue;
      TplDepStats *this_stats =
          &tpl_stats[av1_tpl_ptr_pos(row, col, tpl_stride, block_mis_log2)];
      double cbcmp = (double)this_stats->srcrf_dist;
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      intra_cost += log(dist_scaled) * cbcmp;
      mc_dep_cost += log(dist_scaled + mc_dep_delta) * cbcmp;
      mc_dep_reg += log(3 * dist_scaled + mc_dep_delta) * cbcmp;
      srcrf_dist += (double)(this_stats->srcrf_dist << RDDIV_BITS);
      srcrf_sse += (double)(this_stats->srcrf_sse << RDDIV_BITS);
      srcrf_rate += (double)(this_stats->srcrf_rate << TPL_DEP_COST_SCALE_LOG2);
#ifndef NDEBUG
      mi_count++;
#endif
      cbcmp_base += cbcmp;
    }
  }
  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);

  int offset = 0;
  double beta = 1.0;
  double rk;
  if (mc_dep_cost > 0 && intra_cost > 0) {
    const double r0 = cpi->rd.r0;
    rk = exp((intra_cost - mc_dep_cost) / cbcmp_base);
    td->mb.rb = exp((intra_cost - mc_dep_reg) / cbcmp_base);
    beta = (r0 / rk);
    assert(beta > 0.0);
  } else {
    return base_qindex;
  }
  offset = av1_get_deltaq_offset(cm->seq_params->bit_depth, base_qindex, beta);

  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  offset = AOMMIN(offset, delta_q_info->delta_q_res * 9 - 1);
  offset = AOMMAX(offset, -delta_q_info->delta_q_res * 9 + 1);
  int qindex = cm->quant_params.base_qindex + offset;
  qindex = AOMMIN(qindex, MAXQ);
  qindex = AOMMAX(qindex, MINQ);

  int frm_qstep = av1_dc_quant_QTX(base_qindex, 0, cm->seq_params->bit_depth);
  int sbs_qstep =
      av1_dc_quant_QTX(base_qindex, offset, cm->seq_params->bit_depth);

  if (delta_dist) {
    double sbs_dist = srcrf_dist * pow((double)sbs_qstep / frm_qstep, 2.0);
    double sbs_rate = srcrf_rate * ((double)frm_qstep / sbs_qstep);
    sbs_dist = AOMMIN(sbs_dist, srcrf_sse);
    *delta_dist = (int64_t)((sbs_dist - srcrf_dist) / rk);
    *delta_dist += RDCOST(tpl_frame->base_rdmult, 4 * 256, 0);
    *delta_dist += RDCOST(tpl_frame->base_rdmult, sbs_rate - srcrf_rate, 0);
  }
  return qindex;
}